

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O2

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters,
          iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  pointer puVar1;
  bool bVar2;
  long lVar3;
  reference plVar4;
  long lVar5;
  size_t element_index;
  ulong uVar6;
  
  uVar6 = 0;
  while( true ) {
    puVar1 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if ((lVar3 >> 3) - 1U <= uVar6) break;
    plVar4 = boost::iterator_range_detail::
             iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
             ::operator[](&range->
                           super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                          ,puVar1[uVar6] + branch->preceding_elements);
    *(long *)(branch->index * 8 + *(long *)this + uVar6 * 8) = *plVar4;
    uVar6 = uVar6 + 1;
  }
  lVar5 = branch->index * 8 + *(long *)this;
  bVar2 = std::
          is_sorted<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::less<void>>
                    (lVar5,lVar3 + lVar5 + -8);
  if (bVar2) {
    return;
  }
  __assert_fail("std::is_sorted ( m_values.begin() + static_cast<difference_type>(branch.index), m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1), m_compare )"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x1bc,
                "void burst::k_ary_search_set<long>::fill_node(const k_ary_search_set_branch &, const std::vector<std::size_t> &, const RandomAccessRange &) [Value = long, Compare = std::less<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<long *, std::vector<long>>>]"
               );
}

Assistant:

void
            fill_node
            (
                const k_ary_search_set_branch & branch,
                const std::vector<std::size_t> & counters,
                const RandomAccessRange & range
            )
        {
            for
            (
                std::size_t element_index = 0;
                element_index < counters.size() - 1;
                ++element_index
            )
            {
                using difference_type = typename RandomAccessRange::difference_type;
                const auto index_in_initial_range =
                    static_cast<difference_type>
                    (
                        branch.preceding_elements + counters[element_index]
                    );
                m_values[branch.index + element_index] = range[index_in_initial_range];
            }
            BOOST_ASSERT(std::is_sorted
            (
                m_values.begin() + static_cast<difference_type>(branch.index),
                m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1),
                m_compare
            ));
        }